

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

color_quad_u8 scale_color(color_quad_u8 *pC,color_cell_compressor_params *pParams)

{
  byte bVar1;
  uint uVar2;
  uint32_t v;
  uint32_t i;
  uint32_t n;
  color_cell_compressor_params *pParams_local;
  color_quad_u8 *pC_local;
  color_quad_u8 results;
  
  bVar1 = (char)pParams->m_comp_bits + (pParams->m_has_pbits != '\0');
  for (i = 0; i < 4; i = i + 1) {
    uVar2 = (uint)pC->m_c[i] << (8 - bVar1 & 0x1f);
    results.m_c[i] = (byte)(uVar2 >> (bVar1 & 0x1f)) | (byte)uVar2;
  }
  return (color_quad_u8)results.m_c;
}

Assistant:

static inline color_quad_u8 scale_color(const color_quad_u8 *pC, const color_cell_compressor_params *pParams)
{
	color_quad_u8 results;

	const uint32_t n = pParams->m_comp_bits + (pParams->m_has_pbits ? 1 : 0);
	assert((n >= 4) && (n <= 8));

	for (uint32_t i = 0; i < 4; i++)
	{
		uint32_t v = pC->m_c[i] << (8 - n);
		v |= (v >> n);
		assert(v <= 255);
		results.m_c[i] = (uint8_t)(v);
	}

	return results;
}